

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

void enet_peer_dispatch_incoming_unreliable_commands(ENetPeer *peer,ENetChannel *channel)

{
  ushort uVar1;
  long in_RSI;
  void *in_RDI;
  enet_uint16 currentWindow;
  enet_uint16 reliableWindow;
  ENetIncomingCommand *incomingCommand;
  ENetListIterator currentCommand;
  ENetListIterator startCommand;
  ENetListIterator droppedCommand;
  ushort local_32;
  ENetListIterator in_stack_ffffffffffffffd0;
  _ENetListNode *startCommand_00;
  ENetListIterator pEVar2;
  _ENetListNode *queue;
  _ENetListNode *local_18;
  
  queue = *(_ENetListNode **)(in_RSI + 0x40);
  startCommand_00 = queue;
  local_18 = queue;
  while (startCommand_00 != (ENetListIterator)(in_RSI + 0x40)) {
    pEVar2 = startCommand_00;
    if (((ulong)startCommand_00[1].next & 0xf00000000) != 0x900000000) {
      if (*(short *)&startCommand_00[1].next == *(short *)(in_RSI + 0x26)) {
        if (*(int *)((long)&startCommand_00[4].previous + 4) == 0) {
          *(undefined2 *)(in_RSI + 0x28) = *(undefined2 *)((long)&startCommand_00[1].next + 2);
          goto LAB_00107ca8;
        }
        if (queue == startCommand_00) {
          if (local_18 != startCommand_00) {
            local_18 = startCommand_00->previous;
          }
        }
        else {
          enet_list_move((ENetListIterator)((long)in_RDI + 0x130),queue,startCommand_00->previous);
          local_18 = pEVar2;
          if (*(int *)((long)in_RDI + 0x140) == 0) {
            enet_list_insert((ENetListIterator)(*(long *)((long)in_RDI + 0x10) + 0x48),in_RDI);
            *(undefined4 *)((long)in_RDI + 0x140) = 1;
            local_18 = pEVar2;
          }
        }
      }
      else {
        local_32 = *(ushort *)&startCommand_00[1].next / 0x1000;
        uVar1 = *(ushort *)(in_RSI + 0x26) / 0x1000;
        if (*(ushort *)&startCommand_00[1].next < *(ushort *)(in_RSI + 0x26)) {
          local_32 = local_32 + 0x10;
        }
        if ((uVar1 <= local_32) &&
           (in_stack_ffffffffffffffd0 = startCommand_00, local_32 < (ushort)(uVar1 + 7))) break;
        local_18 = startCommand_00->next;
        if ((queue != startCommand_00) &&
           (enet_list_move((ENetListIterator)((long)in_RDI + 0x130),queue,startCommand_00->previous)
           , *(int *)((long)in_RDI + 0x140) == 0)) {
          enet_list_insert((ENetListIterator)(*(long *)((long)in_RDI + 0x10) + 0x48),in_RDI);
          *(undefined4 *)((long)in_RDI + 0x140) = 1;
        }
      }
      queue = pEVar2->next;
    }
LAB_00107ca8:
    in_stack_ffffffffffffffd0 = startCommand_00;
    startCommand_00 = pEVar2->next;
  }
  if ((queue != startCommand_00) &&
     (enet_list_move((ENetListIterator)((long)in_RDI + 0x130),queue,startCommand_00->previous),
     *(int *)((long)in_RDI + 0x140) == 0)) {
    enet_list_insert((ENetListIterator)(*(long *)((long)in_RDI + 0x10) + 0x48),in_RDI);
    *(undefined4 *)((long)in_RDI + 0x140) = 1;
  }
  enet_peer_remove_incoming_commands((ENetList *)queue,startCommand_00,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void
enet_peer_dispatch_incoming_unreliable_commands (ENetPeer * peer, ENetChannel * channel)
{
    ENetListIterator droppedCommand, startCommand, currentCommand;

    for (droppedCommand = startCommand = currentCommand = enet_list_begin (& channel -> incomingUnreliableCommands);
         currentCommand != enet_list_end (& channel -> incomingUnreliableCommands);
         currentCommand = enet_list_next (currentCommand))
    {
       ENetIncomingCommand * incomingCommand = (ENetIncomingCommand *) currentCommand;

       if ((incomingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_MASK) == ENET_PROTOCOL_COMMAND_SEND_UNSEQUENCED)
         continue;

       if (incomingCommand -> reliableSequenceNumber == channel -> incomingReliableSequenceNumber)
       {
          if (incomingCommand -> fragmentsRemaining <= 0)
          {
             channel -> incomingUnreliableSequenceNumber = incomingCommand -> unreliableSequenceNumber;
             continue;
          }

          if (startCommand != currentCommand)
          {
             enet_list_move (enet_list_end (& peer -> dispatchedCommands), startCommand, enet_list_previous (currentCommand));

             if (! peer -> needsDispatch)
             {
                enet_list_insert (enet_list_end (& peer -> host -> dispatchQueue), & peer -> dispatchList);

                peer -> needsDispatch = 1;
             }

             droppedCommand = currentCommand;
          }
          else
          if (droppedCommand != currentCommand)
            droppedCommand = enet_list_previous (currentCommand);
       }
       else 
       {
          enet_uint16 reliableWindow = incomingCommand -> reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE,
                      currentWindow = channel -> incomingReliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
          if (incomingCommand -> reliableSequenceNumber < channel -> incomingReliableSequenceNumber)
            reliableWindow += ENET_PEER_RELIABLE_WINDOWS;
          if (reliableWindow >= currentWindow && reliableWindow < currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS - 1)
            break;

          droppedCommand = enet_list_next (currentCommand);

          if (startCommand != currentCommand)
          {
             enet_list_move (enet_list_end (& peer -> dispatchedCommands), startCommand, enet_list_previous (currentCommand));

             if (! peer -> needsDispatch)
             {
                enet_list_insert (enet_list_end (& peer -> host -> dispatchQueue), & peer -> dispatchList);

                peer -> needsDispatch = 1;
             }
          }
       }
          
       startCommand = enet_list_next (currentCommand);
    }

    if (startCommand != currentCommand)
    {
       enet_list_move (enet_list_end (& peer -> dispatchedCommands), startCommand, enet_list_previous (currentCommand));

       if (! peer -> needsDispatch)
       {
           enet_list_insert (enet_list_end (& peer -> host -> dispatchQueue), & peer -> dispatchList);

           peer -> needsDispatch = 1;
       }

       droppedCommand = currentCommand;
    }

    enet_peer_remove_incoming_commands (& channel -> incomingUnreliableCommands, enet_list_begin (& channel -> incomingUnreliableCommands), droppedCommand);
}